

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O3

void simgui_render(void)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  float fVar3;
  float fVar4;
  int iVar5;
  ImDrawList *pIVar6;
  ImDrawCmd *pIVar7;
  code *pcVar8;
  ImTextureID pvVar9;
  size_t __n_00;
  int iVar10;
  float fVar11;
  void *pvVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  ImDrawData *pIVar16;
  ImGuiIO *pIVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  wchar_t wVar21;
  wchar_t base_element;
  ulong uVar22;
  wchar_t height;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  sg_bindings bind;
  ImTextureID local_158;
  sg_range local_110;
  ImVec2 local_100;
  undefined8 local_f8;
  sg_range local_f0;
  undefined8 local_e0;
  ulong local_d8;
  int local_bc;
  sg_buffer local_9c;
  int local_98;
  sg_image local_64;
  
  igRender();
  pIVar16 = igGetDrawData();
  pIVar17 = igGetIO();
  sVar15 = _simgui.indices.size;
  pvVar14 = _simgui.indices.ptr;
  sVar13 = _simgui.vertices.size;
  pvVar12 = _simgui.vertices.ptr;
  if (((pIVar16 != (ImDrawData *)0x0) && (pIVar16->CmdListsCount != 0)) &&
     (0 < pIVar16->CmdListsCount)) {
    uVar23 = 0;
    uVar22 = 0;
    uVar25 = 0;
    do {
      pIVar6 = pIVar16->CmdLists[uVar23];
      iVar19 = (pIVar6->VtxBuffer).Size;
      __n_00 = (long)iVar19 * 0x14;
      uVar1 = __n_00 + uVar25;
      if (sVar13 < uVar1) break;
      wVar21 = (pIVar6->IdxBuffer).Size;
      __n = (long)wVar21 * 2;
      uVar2 = __n + uVar22;
      if (sVar15 < uVar2) break;
      if (iVar19 != 0) {
        memcpy((void *)(uVar25 + (long)pvVar12),(pIVar6->VtxBuffer).Data,__n_00);
      }
      if (wVar21 != L'\0') {
        memcpy((void *)(uVar22 + (long)pvVar14),(pIVar6->IdxBuffer).Data,__n);
      }
      uVar23 = uVar23 + 1;
      uVar25 = uVar1;
      uVar22 = uVar2;
    } while ((long)uVar23 < (long)pIVar16->CmdListsCount);
    if ((int)uVar23 != 0) {
      if (_sg.valid == false) {
        __assert_fail("_sg.valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                      ,0x3c9b,"void sg_push_debug_group(const char *)");
      }
      if (uVar25 != 0) {
        local_e0 = _simgui.vertices.ptr;
        local_d8 = uVar25;
        sg_update_buffer(_simgui.vbuf,(sg_range *)&local_e0);
      }
      if (uVar22 != 0) {
        local_e0 = _simgui.indices.ptr;
        local_d8 = uVar22;
        sg_update_buffer(_simgui.ibuf,(sg_range *)&local_e0);
      }
      fVar11 = _simgui.desc.dpi_scale;
      wVar21 = (wchar_t)((pIVar17->DisplaySize).x * _simgui.desc.dpi_scale);
      height = (wchar_t)((pIVar17->DisplaySize).y * _simgui.desc.dpi_scale);
      uVar25 = 0;
      sg_apply_viewport(L'\0',L'\0',wVar21,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar21,height,true);
      sg_apply_pipeline(_simgui.pip);
      local_f0.ptr = &local_100;
      local_f8 = 0;
      local_100 = pIVar17->DisplaySize;
      local_f0.size = 0x10;
      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f0);
      memset(&local_e0,0,0xb0);
      local_e0 = (void *)CONCAT44(_simgui.vbuf.id,(uint32_t)local_e0);
      local_9c.id = _simgui.ibuf.id;
      local_158 = pIVar17->Fonts->TexID;
      local_64.id = (uint32_t)local_158;
      iVar19 = 0;
      iVar20 = 0;
      do {
        pIVar6 = pIVar16->CmdLists[uVar25];
        local_bc = iVar19;
        local_98 = iVar20;
        sg_apply_bindings((sg_bindings *)&local_e0);
        lVar18 = (long)(pIVar6->CmdBuffer).Size;
        if (0 < lVar18) {
          lVar24 = 0;
          iVar10 = 0;
          base_element = L'\0';
          do {
            pIVar7 = (pIVar6->CmdBuffer).Data;
            pcVar8 = *(code **)((long)&pIVar7->UserCallback + lVar24);
            if (pcVar8 == (code *)0x0) {
              pvVar9 = *(ImTextureID *)((long)&pIVar7->TextureId + lVar24);
              iVar5 = *(int *)((long)&pIVar7->VtxOffset + lVar24);
              if ((local_158 != pvVar9) || (iVar10 != iVar5)) {
                local_64.id = (uint32_t)pvVar9;
                local_bc = iVar19 + iVar5 * 0x14;
                sg_apply_bindings((sg_bindings *)&local_e0);
                local_158 = pvVar9;
                iVar10 = iVar5;
              }
              fVar3 = *(float *)((long)&(pIVar7->ClipRect).x + lVar24);
              fVar4 = *(float *)((long)&(pIVar7->ClipRect).y + lVar24);
              sg_apply_scissor_rect
                        ((int)(fVar11 * fVar3),(int)(fVar11 * fVar4),
                         (int)((*(float *)((long)&(pIVar7->ClipRect).z + lVar24) - fVar3) * fVar11),
                         (int)((*(float *)((long)&(pIVar7->ClipRect).w + lVar24) - fVar4) * fVar11),
                         true);
              sg_draw(base_element,*(wchar_t *)((long)&pIVar7->ElemCount + lVar24),L'\x01');
            }
            else {
              (*pcVar8)();
              sg_apply_viewport(L'\0',L'\0',wVar21,height,true);
              sg_apply_pipeline(_simgui.pip);
              local_110.ptr = &local_100;
              local_110.size = 0x10;
              sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_110);
              sg_apply_bindings((sg_bindings *)&local_e0);
            }
            base_element = base_element + *(int *)((long)&pIVar7->ElemCount + lVar24);
            lVar24 = lVar24 + 0x38;
          } while (lVar18 * 0x38 != lVar24);
        }
        iVar19 = iVar19 + (pIVar6->VtxBuffer).Size * 0x14;
        iVar20 = iVar20 + (pIVar6->IdxBuffer).Size * 2;
        uVar25 = uVar25 + 1;
      } while (uVar25 != (uVar23 & 0xffffffff));
      sg_apply_viewport(L'\0',L'\0',wVar21,height,true);
      sg_apply_scissor_rect(L'\0',L'\0',wVar21,height,true);
      if (_sg.valid == false) {
        __assert_fail("_sg.valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                      ,0x3ca2,"void sg_pop_debug_group(void)");
      }
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void simgui_render(void) {
    #if defined(__cplusplus)
        ImGui::Render();
        ImDrawData* draw_data = ImGui::GetDrawData();
        ImGuiIO* io = &ImGui::GetIO();
    #else
        igRender();
        ImDrawData* draw_data = igGetDrawData();
        ImGuiIO* io = igGetIO();
    #endif
    if (0 == draw_data) {
        return;
    }
    if (draw_data->CmdListsCount == 0) {
        return;
    }
    /* copy vertices and indices into an intermediate buffer so that
       they can be updated with a single sg_update_buffer() call each
       (sg_append_buffer() has performance problems on some GL platforms),
       also keep track of valid number of command lists in case of a
       buffer overflow
    */
    size_t all_vtx_size = 0;
    size_t all_idx_size = 0;
    int cmd_list_count = 0;
    for (int cl_index = 0; cl_index < draw_data->CmdListsCount; cl_index++, cmd_list_count++) {
        ImDrawList* cl = draw_data->CmdLists[cl_index];
        const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
        const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);

        /* check for buffer overflow */
        if (((all_vtx_size + vtx_size) > _simgui.vertices.size) ||
            ((all_idx_size + idx_size) > _simgui.indices.size))
        {
            break;
        }

        /* copy vertices and indices into common buffers */
        if (vtx_size > 0) {
            const ImDrawVert* src_vtx_ptr = cl->VtxBuffer.Data;
            void* dst_vtx_ptr = (void*) (((uint8_t*)_simgui.vertices.ptr) + all_vtx_size);
            memcpy(dst_vtx_ptr, src_vtx_ptr, vtx_size);
        }
        if (idx_size > 0) {
            const ImDrawIdx* src_idx_ptr = cl->IdxBuffer.Data;
            void* dst_idx_ptr = (void*) (((uint8_t*)_simgui.indices.ptr) + all_idx_size);
            memcpy(dst_idx_ptr, src_idx_ptr, idx_size);
        }
        all_vtx_size += vtx_size;
        all_idx_size += idx_size;
    }
    if (0 == cmd_list_count) {
        return;
    }

    /* update the sokol-gfx vertex- and index-buffer */
    sg_push_debug_group("sokol-imgui");
    if (all_vtx_size > 0) {
        sg_range vtx_data = _simgui.vertices;
        vtx_data.size = all_vtx_size;
        sg_update_buffer(_simgui.vbuf, &vtx_data);
    }
    if (all_idx_size > 0) {
        sg_range idx_data = _simgui.indices;
        idx_data.size = all_idx_size;
        sg_update_buffer(_simgui.ibuf, &idx_data);
    }

    /* render the ImGui command list */
    const float dpi_scale = _simgui.desc.dpi_scale;
    const int fb_width = (int) (io->DisplaySize.x * dpi_scale);
    const int fb_height = (int) (io->DisplaySize.y * dpi_scale);
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);

    sg_apply_pipeline(_simgui.pip);
    _simgui_vs_params_t vs_params;
    memset((void*)&vs_params, 0, sizeof(vs_params));
    vs_params.disp_size.x = io->DisplaySize.x;
    vs_params.disp_size.y = io->DisplaySize.y;
    sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
    sg_bindings bind;
    memset((void*)&bind, 0, sizeof(bind));
    bind.vertex_buffers[0] = _simgui.vbuf;
    bind.index_buffer = _simgui.ibuf;
    ImTextureID tex_id = io->Fonts->TexID;
    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
    int vb_offset = 0;
    int ib_offset = 0;
    for (int cl_index = 0; cl_index < cmd_list_count; cl_index++) {
        const ImDrawList* cl = draw_data->CmdLists[cl_index];

        bind.vertex_buffer_offsets[0] = vb_offset;
        bind.index_buffer_offset = ib_offset;
        sg_apply_bindings(&bind);

        int base_element = 0;
        #if defined(__cplusplus)
            const int num_cmds = cl->CmdBuffer.size();
        #else
            const int num_cmds = cl->CmdBuffer.Size;
        #endif
        uint32_t vtx_offset = 0;
        for (int cmd_index = 0; cmd_index < num_cmds; cmd_index++) {
            ImDrawCmd* pcmd = &cl->CmdBuffer.Data[cmd_index];
            if (pcmd->UserCallback) {
                pcmd->UserCallback(cl, pcmd);
                // need to re-apply all state after calling a user callback
                sg_apply_viewport(0, 0, fb_width, fb_height, true);
                sg_apply_pipeline(_simgui.pip);
                sg_apply_uniforms(SG_SHADERSTAGE_VS, 0, SG_RANGE_REF(vs_params));
                sg_apply_bindings(&bind);
            }
            else {
                if ((tex_id != pcmd->TextureId) || (vtx_offset != pcmd->VtxOffset)) {
                    tex_id = pcmd->TextureId;
                    vtx_offset = pcmd->VtxOffset;
                    bind.fs_images[0].id = (uint32_t)(uintptr_t)tex_id;
                    bind.vertex_buffer_offsets[0] = vb_offset + (int)(pcmd->VtxOffset * sizeof(ImDrawVert));
                    sg_apply_bindings(&bind);
                }
                const int scissor_x = (int) (pcmd->ClipRect.x * dpi_scale);
                const int scissor_y = (int) (pcmd->ClipRect.y * dpi_scale);
                const int scissor_w = (int) ((pcmd->ClipRect.z - pcmd->ClipRect.x) * dpi_scale);
                const int scissor_h = (int) ((pcmd->ClipRect.w - pcmd->ClipRect.y) * dpi_scale);
                sg_apply_scissor_rect(scissor_x, scissor_y, scissor_w, scissor_h, true);
                sg_draw(base_element, (int)pcmd->ElemCount, 1);
            }
            base_element += (int)pcmd->ElemCount;
        }
        #if defined(__cplusplus)
            const size_t vtx_size = cl->VtxBuffer.size() * sizeof(ImDrawVert);
            const size_t idx_size = cl->IdxBuffer.size() * sizeof(ImDrawIdx);
        #else
            const size_t vtx_size = (size_t)cl->VtxBuffer.Size * sizeof(ImDrawVert);
            const size_t idx_size = (size_t)cl->IdxBuffer.Size * sizeof(ImDrawIdx);
        #endif
        vb_offset += (int)vtx_size;
        ib_offset += (int)idx_size;
    }
    sg_apply_viewport(0, 0, fb_width, fb_height, true);
    sg_apply_scissor_rect(0, 0, fb_width, fb_height, true);
    sg_pop_debug_group();
}